

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  pointer pTVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  long lVar7;
  FILE *pFVar8;
  ostream *poVar9;
  bool bVar10;
  pointer pTVar11;
  char *pcVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  int local_31c;
  char *local_318;
  char *local_310;
  DBSQLite db;
  vector<Tle,_std::allocator<Tle>_> results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string line;
  vector<Tle,_std::allocator<Tle>_> local_298;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ulong local_250;
  undefined1 local_248 [16];
  SatLookAngles TLEsAndLAs;
  
  local_31c = -1;
  local_318 = "./.satnow.sql3";
  local_278 = ZEXT816(0);
  local_250 = 0;
  local_268 = ZEXT816(0);
  local_310 = (char *)0x0;
  local_248 = ZEXT816(0);
  bVar3 = false;
switchD_00108e13_caseD_67:
  bVar10 = bVar3;
  iVar4 = getopt_long(argc,argv,"ghva:d:r:u:x:y:",opts,0);
  if (iVar4 < 1) {
    if ((90.0 < ABS((double)local_278._0_8_)) || (180.0 < ABS((double)local_268._0_8_))) {
      std::operator<<((ostream *)&std::cerr,"[-] Invalid coordinates (latitude: ");
      poVar9 = std::ostream::_M_insert<double>((double)local_278._0_8_);
      std::operator<<(poVar9,", longitude: ");
      poVar9 = std::ostream::_M_insert<double>((double)local_268._0_8_);
      poVar9 = std::operator<<(poVar9,')');
    }
    else {
      std::operator<<((ostream *)&std::cout,"[+] Using viewer position (latitude: ");
      poVar9 = std::ostream::_M_insert<double>((double)local_278._0_8_);
      std::operator<<(poVar9,", longitude: ");
      poVar9 = std::ostream::_M_insert<double>((double)local_268._0_8_);
      poVar9 = std::operator<<(poVar9,", ");
      std::operator<<(poVar9,", altitude: ");
      poVar9 = std::ostream::_M_insert<double>((double)local_248._0_8_);
      poVar9 = std::operator<<(poVar9,')');
      std::endl<char,std::char_traits<char>>(poVar9);
      if (local_318 != (char *)0x0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"[+] Using database: ");
        poVar9 = std::operator<<(poVar9,local_318);
        std::endl<char,std::char_traits<char>>(poVar9);
        DBSQLite::DBSQLite(&db,local_318);
        bVar3 = DBSQLite::ok(&db);
        if (!bVar3) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"[-] Error opening database \'");
          poVar9 = std::operator<<(poVar9,local_318);
          poVar9 = std::operator<<(poVar9,"\': ");
          DBSQLite::getErrorString_abi_cxx11_((string *)&TLEsAndLAs,&db);
          poVar9 = std::operator<<(poVar9,(string *)&TLEsAndLAs);
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__cxx11::string::~string((string *)&TLEsAndLAs);
          iVar4 = 1;
          goto LAB_0010960e;
        }
        if (local_310 == (char *)0x0) goto LAB_00109582;
        iVar4 = (*db.super_DB._vptr_DB[2])();
        if ((char)iVar4 == '\0') {
          __assert_fail("sourceFile && db.ok() && \"Invalid input to update.\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/enferex[P]satnow/main.cc"
                        ,0xb8,"void update(const char *, DB &, bool)");
        }
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        std::ifstream::ifstream(&TLEsAndLAs,local_310,_S_in);
        results.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        results.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        results.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        goto LAB_00109062;
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "[-] The database path must not be empty (see --help).");
    }
    std::endl<char,std::char_traits<char>>(poVar9);
    return 1;
  }
  bVar3 = bVar10;
  if (7 < iVar4 - 0x72U) goto code_r0x00108e03;
  switch(iVar4) {
  case 0x72:
    std::__cxx11::string::string((string *)&TLEsAndLAs,_optarg,(allocator *)&line);
    local_31c = std::__cxx11::stoi((string *)&TLEsAndLAs,(size_t *)0x0,10);
    break;
  default:
    goto switchD_00108dc8_caseD_73;
  case 0x75:
    local_310 = _optarg;
    goto switchD_00108e13_caseD_67;
  case 0x76:
    local_250 = CONCAT71((int7)((ulong)((long)&switchD_00108dc8::switchdataD_00114070 +
                                       (long)(int)(&switchD_00108dc8::switchdataD_00114070)
                                                  [iVar4 - 0x72U]) >> 8),1);
    goto switchD_00108e13_caseD_67;
  case 0x78:
    std::__cxx11::string::string((string *)&TLEsAndLAs,_optarg,(allocator *)&line);
    dVar1 = std::__cxx11::stod((string *)&TLEsAndLAs,(size_t *)0x0);
    local_278._8_4_ = extraout_XMM0_Dc_01;
    local_278._0_8_ = dVar1;
    local_278._12_4_ = extraout_XMM0_Dd_01;
    break;
  case 0x79:
    std::__cxx11::string::string((string *)&TLEsAndLAs,_optarg,(allocator *)&line);
    dVar1 = std::__cxx11::stod((string *)&TLEsAndLAs,(size_t *)0x0);
    local_268._8_4_ = extraout_XMM0_Dc_00;
    local_268._0_8_ = dVar1;
    local_268._12_4_ = extraout_XMM0_Dd_00;
  }
  goto LAB_00108ea6;
LAB_00109062:
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&TLEsAndLAs,(string *)&line);
    pTVar2 = results.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pTVar11 = results.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      for (; pTVar11 != pTVar2; pTVar11 = pTVar11 + 1) {
        (*db.super_DB._vptr_DB[1])(&db,pTVar11);
        if ((local_250 & 1) != 0) {
          poVar9 = std::operator<<((ostream *)&std::cout,"[+] Refreshing [");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,'/');
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,"]: ");
          std::__cxx11::to_string(&str,pTVar11->norad_number_);
          poVar9 = std::operator<<(poVar9,(string *)&str);
          poVar9 = std::operator<<(poVar9," (");
          std::__cxx11::string::string((string *)&local_298,(string *)pTVar11);
          poVar9 = std::operator<<(poVar9,(string *)&local_298);
          poVar9 = std::operator<<(poVar9,") [");
          iVar4 = (*db.super_DB._vptr_DB[2])(&db);
          pcVar12 = "Failed";
          if ((char)iVar4 != '\0') {
            pcVar12 = "Good";
          }
          poVar9 = std::operator<<(poVar9,pcVar12);
          poVar9 = std::operator<<(poVar9,']');
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&str);
        }
      }
      std::vector<Tle,_std::allocator<Tle>_>::~vector(&results);
      std::ifstream::~ifstream(&TLEsAndLAs);
      std::__cxx11::string::~string((string *)&line);
LAB_00109582:
      getSatellitesAndLookAngles
                (&TLEsAndLAs,(double)local_278._0_8_,(double)local_268._0_8_,(double)local_248._0_8_
                 ,&db.super_DB);
      if (bVar10) {
        DisplayNCurses::DisplayNCurses((DisplayNCurses *)&line,local_31c);
        DisplayNCurses::render((DisplayNCurses *)&line,&TLEsAndLAs);
        DisplayNCurses::~DisplayNCurses((DisplayNCurses *)&line);
      }
      else {
        line._M_dataplus._M_p = (pointer)&PTR_render_00119bf0;
        DisplayConsole::render((DisplayConsole *)&line,&TLEsAndLAs);
      }
      std::
      vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>::
      ~vector(&TLEsAndLAs._sats);
      iVar4 = 0;
LAB_0010960e:
      DBSQLite::~DBSQLite(&db);
      return iVar4;
    }
    lVar6 = std::__cxx11::string::find_first_not_of((char *)&line,0x11476d);
  } while (((lVar6 == -1) ||
           (lVar7 = std::__cxx11::string::find_last_not_of((char *)&line,0x11476c), lVar7 == -1)) ||
          (lVar7 + 1 == lVar6 || line._M_dataplus._M_p[lVar6] == '#'));
  std::__cxx11::string::find_first_of((char *)&line,0x11476c);
  std::__cxx11::string::substr((ulong)&str,(ulong)&line);
  poVar9 = std::operator<<((ostream *)&std::cerr,"[+] Loading TLEs from \'");
  poVar9 = std::operator<<(poVar9,(string *)&str);
  poVar9 = std::operator<<(poVar9,'\'');
  std::endl<char,std::char_traits<char>>(poVar9);
  lVar6 = std::__cxx11::string::find((char *)&str,0x1147cf);
  if ((lVar6 == -1) && (pFVar8 = fopen(str._M_dataplus._M_p,"r"), pFVar8 != (FILE *)0x0)) {
    readTLEs(&local_298,&str,(FILE *)pFVar8);
    std::vector<Tle,std::allocator<Tle>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>,void>
              ((vector<Tle,std::allocator<Tle>> *)&results,
               (const_iterator)
               results.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data
               ._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>_>
                )local_298.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>_>
                )local_298.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    fclose(pFVar8);
    std::vector<Tle,_std::allocator<Tle>_>::~vector(&local_298);
  }
  else {
    lVar6 = curl_easy_init();
    if (((lVar6 != 0) &&
        ((iVar4 = curl_easy_setopt(lVar6,0x2712,str._M_dataplus._M_p), iVar4 == 0 &&
         (lVar7 = std::__cxx11::string::find((char *)&str,0x1147cf), lVar7 != -1)))) &&
       (pFVar8 = tmpfile(), pFVar8 != (FILE *)0x0)) {
      iVar4 = curl_easy_setopt(lVar6,0x2711,pFVar8);
      if (iVar4 == 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"[+] Downloading contents from ");
        poVar9 = std::operator<<(poVar9,(string *)&str);
        std::endl<char,std::char_traits<char>>(poVar9);
        iVar4 = curl_easy_perform(lVar6);
        curl_easy_cleanup(lVar6);
        rewind(pFVar8);
        readTLEs(&local_298,&str,(FILE *)pFVar8);
        std::vector<Tle,std::allocator<Tle>>::
        insert<std::move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>,void>
                  ((vector<Tle,std::allocator<Tle>> *)&results,
                   (const_iterator)
                   results.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (move_iterator<__gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>_>
                    )local_298.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (move_iterator<__gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>_>
                    )local_298.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        fclose(pFVar8);
        std::vector<Tle,_std::allocator<Tle>_>::~vector(&local_298);
        if (iVar4 == 0) goto LAB_00109228;
      }
      else {
        fclose(pFVar8);
        curl_easy_cleanup(lVar6);
      }
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,"[-] Unknown entry in ");
    poVar9 = std::operator<<(poVar9,local_310);
    poVar9 = std::operator<<(poVar9," Line ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
LAB_00109228:
  std::__cxx11::string::~string((string *)&str);
  goto LAB_00109062;
code_r0x00108e03:
  bVar3 = true;
  switch(iVar4) {
  case 0x61:
    std::__cxx11::string::string((string *)&TLEsAndLAs,_optarg,(allocator *)&line);
    dVar1 = std::__cxx11::stod((string *)&TLEsAndLAs,(size_t *)0x0);
    local_248._8_4_ = extraout_XMM0_Dc;
    local_248._0_8_ = dVar1;
    local_248._12_4_ = extraout_XMM0_Dd;
    break;
  default:
    goto switchD_00108dc8_caseD_73;
  case 100:
    local_318 = _optarg;
    bVar3 = bVar10;
  case 0x67:
    goto switchD_00108e13_caseD_67;
  case 0x68:
    usage(*argv);
  }
LAB_00108ea6:
  std::__cxx11::string::~string((string *)&TLEsAndLAs);
  bVar3 = bVar10;
  goto switchD_00108e13_caseD_67;
switchD_00108dc8_caseD_73:
  poVar9 = std::operator<<((ostream *)&std::cerr,"[-] Unknown command line option.");
  std::endl<char,std::char_traits<char>>(poVar9);
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
  double alt = 0.0, lat = 0.0, lon = 0.0;
  bool verbose = false, gui = false;
  const char *sourceFile = nullptr, *dbFile = DEFAULT_DB_PATH;
  int opt, refreshRate = -1;
  const char *optStr = "ghva:d:r:u:x:y:";
  while ((opt = getopt_long(argc, argv, optStr, opts, nullptr)) > 0) {
    switch (opt) {
#if HAVE_GUI
    case 'g':
      gui = true;
      break;
    case 'r':
      refreshRate = std::stoi(optarg);
      break;
#endif
    case 'h':
      usage(argv[0]);
      break;
    case 'v':
      verbose = true;
      break;
    case 'a':
      alt = std::stod(optarg);
      break;
    case 'd':
      dbFile = optarg;
      break;
    case 'u':
      sourceFile = optarg;
      break;
    case 'x':
      lat = std::stod(optarg);
      break;
    case 'y':
      lon = std::stod(optarg);
      break;
    default:
      std::cerr << "[-] Unknown command line option." << std::endl;
      exit(EXIT_FAILURE);
      break;
    }
  }

  // Ensure we have valid coords.
  if (lat > 90.0 || lat < -90.0 || lon > 180.0 || lon < -180.0) {
    std::cerr << "[-] Invalid coordinates (latitude: " << lat
              << ", longitude: " << lon << ')' << std::endl;
    return EXIT_FAILURE;
  }
  std::cout << "[+] Using viewer position (latitude: " << lat
            << ", longitude: " << lon << ", "
            << ", altitude: " << alt << ')' << std::endl;

  // Open the database that contains the TLE data.
  if (!dbFile) {
    std::cerr << "[-] The database path must not be empty (see --help)."
              << std::endl;
    return EXIT_FAILURE;
  }
  std::cout << "[+] Using database: " << dbFile << std::endl;

  DBSQLite db(dbFile);
  if (!db.ok()) {
    std::cerr << "[-] Error opening database '" << dbFile
              << "': " << db.getErrorString() << std::endl;
    return EXIT_FAILURE;
  }

  // If a source file is specified, then update the existing database.
  if (sourceFile)
    update(sourceFile, db, verbose);

  // Calculate and display.
  auto TLEsAndLAs = getSatellitesAndLookAngles(lat, lon, alt, db);
  if (gui) {
    DisplayNCurses disp(refreshRate);
    disp.render(TLEsAndLAs);
  } else {
    DisplayConsole disp;
    disp.render(TLEsAndLAs);
  }

  return 0;
}